

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O2

CURLcode operate(GlobalConfig *global,int argc,char **argv)

{
  _Bool _Var1;
  _Bool _Var2;
  undefined8 uVar3;
  int iVar4;
  ParameterError PVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  uint uVar8;
  char *__s1;
  CURLSH *share;
  per_transfer *ppVar9;
  per_transfer **pppVar10;
  long lVar11;
  time_t tVar12;
  long lVar13;
  bool bVar14;
  GlobalConfig *pGVar15;
  GlobalConfig *pGVar16;
  OperationConfig *config;
  size_t i;
  ulong uVar17;
  timeval tVar18;
  timeval newer;
  timeval older;
  ulong uStack_b0;
  _Bool retry_1;
  GlobalConfig *local_a0;
  _Bool retry_2;
  undefined7 uStack_97;
  _Bool retry;
  undefined7 uStack_8f;
  GlobalConfig *local_88;
  CURLM *local_80;
  CURLSH *local_78;
  undefined8 local_70;
  int local_68;
  timeval local_60;
  _Bool local_50;
  _Bool local_4f;
  undefined2 local_4e;
  time_t local_48;
  __suseconds_t local_40;
  int rc;
  
  local_a0 = global;
  if (argc < 2) {
    __s1 = (char *)0x0;
  }
  else {
    __s1 = strdup(argv[1]);
  }
  setlocale(6,"");
  setlocale(1,"C");
  if (argc == 1) {
LAB_00113e81:
    pGVar15 = local_a0;
    CVar6 = CURLE_OK;
    parseconfig((char *)0x0,local_a0);
    bVar14 = true;
    if ((argc < 2) && (pGVar15->first->url_list == (getout *)0x0)) {
      bVar14 = false;
      helpf(tool_stderr,(char *)0x0);
      CVar6 = CURLE_FAILED_INIT;
    }
  }
  else {
    CVar6 = CURLE_OK;
    bVar14 = true;
    if ((__s1 != (char *)0x0) &&
       (((*__s1 != '-' || (__s1[1] != 'q')) && (iVar4 = strcmp(__s1,"--disable"), iVar4 != 0))))
    goto LAB_00113e81;
  }
  free(__s1);
  pGVar15 = local_a0;
  if (bVar14) {
    PVar5 = parse_args(local_a0,argc,argv);
    CVar7 = CURLE_OK;
    CVar6 = CURLE_OK;
    switch(PVar5) {
    case PARAM_OK:
      if ((pGVar15->libcurl == (char *)0x0) || (CVar6 = easysrc_init(), CVar6 == CURLE_OK)) {
        config = pGVar15->first;
        share = (CURLSH *)curl_share_init();
        if (share == (CURLSH *)0x0) {
          CVar6 = CURLE_OUT_OF_MEMORY;
          if (pGVar15->libcurl != (char *)0x0) {
            easysrc_cleanup();
          }
        }
        else {
          uStack_b0 = 0x1b;
          i = 0;
          curl_share_setopt(share,1,2);
          curl_share_setopt(share,1,3);
          curl_share_setopt(share,1,4);
          curl_share_setopt(share,1,5);
          curl_share_setopt(share,1,6);
          curl_share_setopt(share,1,7);
          do {
            CVar6 = get_args(config,i);
            if (CVar6 != CURLE_OK) break;
            i = i + 1;
            config = config->next;
          } while (config != (OperationConfig *)0x0);
          pGVar15->current = pGVar15->first;
          _Var1 = pGVar15->noprogress;
          _Var2 = pGVar15->isatty;
          if (CVar6 == CURLE_OK) {
            if (pGVar15->parallel == true) {
              local_70 = 0;
              local_68 = 1;
              local_78 = share;
              local_60 = tvnow();
              local_4e = 0;
              local_48 = time((time_t *)0x0);
              local_88 = pGVar15;
              local_80 = (CURLM *)curl_multi_init();
              if (local_80 != (CURLM *)0x0) {
                CVar6 = add_parallel_transfers(pGVar15,local_80,share,&local_50,&local_4f);
                if (CVar6 == CURLE_OK) {
                  uVar17 = 0;
LAB_001142ce:
                  if ((int)local_70 == 0) {
                    if (local_68 == 0) {
                      if ((local_50 != true) || ((char)local_4e != '\0')) goto LAB_00114545;
                    }
                    else if (((char)local_4e == '\x01') && (local_4e._1_1_ == '\0')) {
                      pppVar10 = &transfers;
                      while (pppVar10 = &((per_transfer *)pppVar10)->next->next,
                            (per_transfer *)pppVar10 != (per_transfer *)0x0) {
                        if (((per_transfer *)pppVar10)->added == true) {
                          ((per_transfer *)pppVar10)->abort = true;
                        }
                      }
                      local_4e = 0x101;
                    }
                    iVar4 = curl_multi_poll(local_80,0,0,1000,0);
                    local_70 = CONCAT44(local_70._4_4_,iVar4);
                    if (iVar4 == 0) {
                      iVar4 = curl_multi_perform(local_80);
                      pGVar16 = local_88;
                      local_70 = CONCAT44(local_70._4_4_,iVar4);
                      if (iVar4 == 0) {
                        bVar14 = false;
                        progress_meter(local_88,&local_60,false);
                        uVar17 = 0;
                        while( true ) {
                          lVar11 = curl_multi_info_read();
                          if (lVar11 == 0) break;
                          uVar3 = *(undefined8 *)(lVar11 + 8);
                          CVar6 = *(CURLcode *)(lVar11 + 0x10);
                          curl_easy_getinfo(uVar3,0x100015,&retry_2);
                          curl_multi_remove_handle(local_80,uVar3);
                          ppVar9 = (per_transfer *)CONCAT71(uStack_97,retry_2);
                          if (((ppVar9->abort == true) && (CVar6 == CURLE_ABORTED_BY_CALLBACK)) &&
                             (ppVar9->errorbuffer != (char *)0x0)) {
                            curl_msnprintf(ppVar9->errorbuffer,0x100,
                                           "Transfer aborted due to critical error in another transfer"
                                          );
                            ppVar9 = (per_transfer *)CONCAT71(uStack_97,retry_2);
                          }
                          CVar6 = post_per_transfer(pGVar16,ppVar9,CVar6,&retry_1,(long *)&retry);
                          progress_finalize((per_transfer *)CONCAT71(uStack_97,retry_2));
                          all_added = all_added + -1;
                          if (retry_1 == true) {
                            lVar11 = CONCAT71(uStack_97,retry_2);
                            *(undefined1 *)(lVar11 + 0x1d3) = 0;
                            lVar13 = CONCAT71(uStack_8f,retry);
                            if (lVar13 == 0) {
                              lVar13 = 0;
                            }
                            else {
                              tVar12 = time((time_t *)0x0);
                              lVar13 = lVar13 / 1000 + tVar12;
                              lVar11 = CONCAT71(uStack_97,retry_2);
                            }
                            *(long *)(lVar11 + 0x180) = lVar13;
                          }
                          else {
                            if (CVar6 != CURLE_OK) {
                              if ((int)uVar17 == 0) {
                                uVar17 = (ulong)CVar6;
                              }
                              if (*(char *)(CONCAT71(uStack_97,retry_2) + 0x1d4) == '\0') {
                                uVar17 = (ulong)CVar6;
                              }
                            }
                            if ((uint)uVar17 < 0x31) {
                              if ((0x10a0008000004U >> (uVar17 & 0x3f) & 1) != 0) goto LAB_0011448b;
                              if (uVar17 != 0) goto LAB_001144b1;
                            }
                            else {
LAB_001144b1:
                              if (pGVar16->fail_early == true) {
LAB_0011448b:
                                local_4e = CONCAT11(local_4e._1_1_,1);
                              }
                            }
                            del_per_transfer((per_transfer *)CONCAT71(uStack_97,retry_2));
                          }
                          bVar14 = true;
                        }
                        pGVar15 = local_a0;
                        if ((char)local_4e == '\0') {
                          tVar12 = local_48;
                          if ((bVar14) || (tVar12 = time((time_t *)0x0), local_48 != tVar12)) {
                            local_48 = tVar12;
                            CVar6 = add_parallel_transfers
                                              (pGVar16,local_80,local_78,&local_50,&local_4f);
                            if (CVar6 != CURLE_OK) {
                              uVar17 = (ulong)CVar6;
                            }
                            if (local_4f == true) {
                              local_68 = 1;
                            }
                          }
                          pGVar15 = local_a0;
                          if ((uint)uVar17 < 0x31) {
                            if ((0x10a0008000004U >> (uVar17 & 0x3f) & 1) == 0) {
                              if (uVar17 != 0) goto LAB_0011453c;
                              goto LAB_001142ce;
                            }
                          }
                          else {
LAB_0011453c:
                            if (pGVar16->fail_early != true) goto LAB_001142ce;
                          }
                          local_4e = CONCAT11(local_4e._1_1_,1);
                        }
                      }
                    }
                    goto LAB_001142ce;
                  }
LAB_00114545:
                  progress_meter(pGVar15,&local_60,true);
                  uStack_b0 = (ulong)((uint)((int)local_70 != 3) * 0x10 + 0x1b);
                  if ((int)local_70 == 0) {
                    uStack_b0 = uVar17;
                  }
                }
                else {
                  uStack_b0 = (ulong)CVar6;
                }
                curl_multi_cleanup(local_80);
              }
            }
            else {
              retry = false;
              CVar6 = create_transfer(pGVar15,share,&retry);
              uStack_b0 = (ulong)CVar6;
              if (CVar6 == CURLE_OK) {
                if (retry == false) {
                  errorf(pGVar15,"no transfer performed");
                  uStack_b0 = 0x1a;
                }
                else {
                  uStack_b0 = 0;
                  CVar6 = CURLE_OK;
                  ppVar9 = transfers;
                  while (ppVar9 != (per_transfer *)0x0) {
                    tVar18 = tvnow();
                    local_40 = tVar18.tv_usec;
                    if (ppVar9->skip == false) {
                      CVar7 = pre_transfer(pGVar15,ppVar9);
                      if ((CVar7 != CURLE_OK) ||
                         ((pGVar15->libcurl != (char *)0x0 &&
                          (CVar7 = easysrc_perform(), CVar7 != CURLE_OK)))) {
                        uStack_b0 = (ulong)CVar7;
                        break;
                      }
                      uVar8 = curl_easy_perform(ppVar9->curl);
                      uStack_b0 = (ulong)uVar8;
                    }
                    CVar6 = post_per_transfer(pGVar15,ppVar9,(CURLcode)uStack_b0,&retry_2,
                                              (long *)&local_88);
                    pGVar16 = local_88;
                    if (retry_2 == true) {
LAB_001141e9:
                      tool_go_sleep((long)pGVar16);
                    }
                    else {
                      bVar14 = true;
                      if (CVar6 < CURLE_SETOPT_OPTION_SYNTAX) {
                        if ((0x10a0008000004U >> ((ulong)CVar6 & 0x3f) & 1) == 0) {
                          if ((ulong)CVar6 != 0) goto LAB_0011428d;
                          goto LAB_0011429c;
                        }
                      }
                      else {
LAB_0011428d:
                        if (local_a0->fail_early == false) {
LAB_0011429c:
                          CVar7 = create_transfer(local_a0,share,&retry);
                          if (CVar7 == CURLE_OK) {
                            bVar14 = false;
                            uStack_b0 = 0;
                          }
                          else {
                            uStack_b0 = (ulong)CVar7;
                            CVar6 = CVar7;
                          }
                        }
                      }
                      ppVar9 = del_per_transfer(ppVar9);
                      pGVar15 = local_a0;
                      if (bVar14) break;
                      if (ppVar9 == (per_transfer *)0x0) {
                        ppVar9 = (per_transfer *)0x0;
                      }
                      else if (local_a0->ms_per_transfer != 0) {
                        newer = tvnow();
                        older.tv_usec = local_40;
                        older.tv_sec = tVar18.tv_sec;
                        lVar11 = tvdiff(newer,older);
                        if (lVar11 < pGVar15->ms_per_transfer) {
                          notef(pGVar15,"Transfer took %ld ms, waits %ldms as set by --rate",lVar11)
                          ;
                          pGVar16 = (GlobalConfig *)(pGVar15->ms_per_transfer - lVar11);
                          goto LAB_001141e9;
                        }
                      }
                    }
                  }
                  if (CVar6 != CURLE_OK) {
                    uStack_b0 = (ulong)CVar6;
                  }
                  if ((int)uStack_b0 == 0) {
                    uStack_b0 = 0;
                  }
                  else {
                    single_transfer_cleanup(pGVar15->current);
                  }
                }
              }
            }
          }
          else {
            uStack_b0 = (ulong)CVar6;
          }
          for (ppVar9 = transfers; CVar6 = (CURLcode)uStack_b0, ppVar9 != (per_transfer *)0x0;
              ppVar9 = del_per_transfer(ppVar9)) {
            CVar7 = post_per_transfer(pGVar15,ppVar9,CVar6,&retry,(long *)&local_88);
            if (CVar6 == CURLE_OK) {
              uStack_b0 = (ulong)CVar7;
            }
            clean_getout(ppVar9->config);
          }
          pGVar15->noprogress = _Var1;
          pGVar15->isatty = _Var2;
          curl_share_cleanup(share);
          if (pGVar15->libcurl != (char *)0x0) {
            easysrc_cleanup();
            dumpeasysrc(pGVar15);
          }
        }
      }
      else {
        errorf(pGVar15,"out of memory");
      }
      break;
    case PARAM_HELP_REQUESTED:
      tool_help(pGVar15->help_category);
      CVar6 = CVar7;
      break;
    case PARAM_MANUAL_REQUESTED:
      hugehelp();
      CVar6 = CVar7;
      break;
    case PARAM_VERSION_INFO_REQUESTED:
      tool_version_info();
      CVar6 = CVar7;
      break;
    case PARAM_ENGINES_REQUESTED:
      tool_list_engines();
      CVar6 = CVar7;
      break;
    case PARAM_CA_EMBED_REQUESTED:
      break;
    case PARAM_LIBCURL_UNSUPPORTED_PROTOCOL:
      CVar6 = CURLE_UNSUPPORTED_PROTOCOL;
      break;
    default:
      if (PVar5 == PARAM_READ_ERROR) {
        CVar6 = CURLE_READ_ERROR;
        break;
      }
    case PARAM_OPTION_AMBIGUOUS:
    case PARAM_OPTION_UNKNOWN:
    case PARAM_REQUIRES_PARAMETER:
    case PARAM_BAD_USE:
    case PARAM_GOT_EXTRA_PARAMETER:
    case PARAM_BAD_NUMERIC:
    case PARAM_NEGATIVE_NUMERIC:
    case PARAM_LIBCURL_DOESNT_SUPPORT:
      CVar6 = CURLE_FAILED_INIT;
    }
  }
  varcleanup(pGVar15);
  return CVar6;
}

Assistant:

CURLcode operate(struct GlobalConfig *global, int argc, argv_item_t argv[])
{
  CURLcode result = CURLE_OK;
  char *first_arg = argc > 1 ? curlx_convert_tchar_to_UTF8(argv[1]) : NULL;

#ifdef HAVE_SETLOCALE
  /* Override locale for number parsing (only) */
  setlocale(LC_ALL, "");
  setlocale(LC_NUMERIC, "C");
#endif

  /* Parse .curlrc if necessary */
  if((argc == 1) ||
     (first_arg && strncmp(first_arg, "-q", 2) &&
      strcmp(first_arg, "--disable"))) {
    parseconfig(NULL, global); /* ignore possible failure */

    /* If we had no arguments then make sure a url was specified in .curlrc */
    if((argc < 2) && (!global->first->url_list)) {
      helpf(tool_stderr, NULL);
      result = CURLE_FAILED_INIT;
    }
  }

  curlx_unicodefree(first_arg);

  if(!result) {
    /* Parse the command line arguments */
    ParameterError res = parse_args(global, argc, argv);
    if(res) {
      result = CURLE_OK;

      /* Check if we were asked for the help */
      if(res == PARAM_HELP_REQUESTED)
        tool_help(global->help_category);
      /* Check if we were asked for the manual */
      else if(res == PARAM_MANUAL_REQUESTED)
        hugehelp();
      /* Check if we were asked for the version information */
      else if(res == PARAM_VERSION_INFO_REQUESTED)
        tool_version_info();
      /* Check if we were asked to list the SSL engines */
      else if(res == PARAM_ENGINES_REQUESTED)
        tool_list_engines();
      /* Check if we were asked to dump the embedded CA bundle */
      else if(res == PARAM_CA_EMBED_REQUESTED) {
#ifdef CURL_CA_EMBED
        printf("%s", curl_ca_embed);
#endif
      }
      else if(res == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL)
        result = CURLE_UNSUPPORTED_PROTOCOL;
      else if(res == PARAM_READ_ERROR)
        result = CURLE_READ_ERROR;
      else
        result = CURLE_FAILED_INIT;
    }
    else {
      if(global->libcurl) {
        /* Initialise the libcurl source output */
        result = easysrc_init();
      }

      /* Perform the main operations */
      if(!result) {
        size_t count = 0;
        struct OperationConfig *operation = global->first;
        CURLSH *share = curl_share_init();
        if(!share) {
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();
          }
          result = CURLE_OUT_OF_MEMORY;
        }

        if(!result) {
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_DNS);
          curl_share_setopt(share, CURLSHOPT_SHARE,
                            CURL_LOCK_DATA_SSL_SESSION);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_PSL);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_HSTS);

          /* Get the required arguments for each operation */
          do {
            result = get_args(operation, count++);

            operation = operation->next;
          } while(!result && operation);

          /* Set the current operation pointer */
          global->current = global->first;

          /* now run! */
          result = run_all_transfers(global, share, result);

          curl_share_cleanup(share);
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();

            /* Dump the libcurl code if previously enabled */
            dumpeasysrc(global);
          }
        }
      }
      else
        errorf(global, "out of memory");
    }
  }

  varcleanup(global);

  return result;
}